

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-cave.c
# Opt level: O1

loc_conflict
choose_random_entrance
          (chunk_conflict *c,wchar_t ridx,loc_conflict *tgt,wchar_t bias,loc_conflict *exc,
          wchar_t nexc)

{
  int iVar1;
  _Bool _Var2;
  uint uVar3;
  wchar_t wVar4;
  int iVar5;
  int iVar6;
  uint32_t uVar7;
  undefined4 *p;
  loc_conflict lVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  long lVar12;
  wchar_t j;
  bool bVar13;
  loc local_50;
  
  if ((ridx < L'\0') || (dun->cent_n <= ridx)) {
    __assert_fail("ridx >= 0 && ridx < dun->cent_n",
                  "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/gen-cave.c"
                  ,0xcc,
                  "struct loc choose_random_entrance(struct chunk *, int, const struct loc *, int, const struct loc *, int)"
                 );
  }
  if (0 < dun->ent_n[(uint)ridx]) {
    p = (undefined4 *)mem_alloc((ulong)(uint)dun->ent_n[(uint)ridx] * 4 + 4);
    *p = 0;
    iVar5 = dun->ent_n[(uint)ridx];
    bVar13 = false;
    if (0 < iVar5) {
      iVar6 = 0;
      lVar12 = 0;
      do {
        _Var2 = square_is_granite_with_flag(c,(loc_conflict)dun->ent[(uint)ridx][lVar12],L'\f');
        if (_Var2) {
          wVar4 = L'\0';
          do {
            if (wVar4 < nexc) {
              lVar8 = loc_diff((loc_conflict)dun->ent[(uint)ridx][lVar12],exc[wVar4]);
              uVar3 = lVar8.x;
              uVar11 = -uVar3;
              if (0 < (int)uVar3) {
                uVar11 = uVar3;
              }
              if (uVar11 < 2) {
                uVar9 = lVar8.y;
                uVar11 = -uVar9;
                if (0 < (int)uVar9) {
                  uVar11 = uVar9;
                }
                if ((uVar11 < 2) && (bVar13 = false, (ulong)lVar8 >> 0x20 != 0 || uVar3 != 0)) {
                  _Var2 = false;
                  goto LAB_0014b906;
                }
              }
              wVar4 = wVar4 + L'\x01';
              bVar13 = true;
            }
            else {
              bVar13 = false;
            }
LAB_0014b906:
          } while (bVar13);
        }
        if (_Var2 == false) {
          p[lVar12 + 1] = p[lVar12];
LAB_0014b9bf:
          bVar13 = true;
        }
        else {
          if (tgt == (loc_conflict *)0x0) {
            p[lVar12 + 1] = p[lVar12] + 1;
LAB_0014b9b3:
            iVar6 = iVar6 + 1;
            goto LAB_0014b9bf;
          }
          if (bias < L'\0') {
            __assert_fail("bias >= 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/gen-cave.c"
                          ,0xf1,
                          "struct loc choose_random_entrance(struct chunk *, int, const struct loc *, int, const struct loc *, int)"
                         );
          }
          wVar4 = distance((loc_conflict)dun->ent[(uint)ridx][lVar12],*tgt);
          if (wVar4 == L'\0') {
            mem_free(p);
            local_50 = dun->ent[(uint)ridx][lVar12];
          }
          else {
            iVar5 = bias - wVar4;
            if (iVar5 < 2) {
              iVar5 = 1;
            }
            p[lVar12 + 1] = iVar5 * iVar5 + p[lVar12];
          }
          if (wVar4 != L'\0') goto LAB_0014b9b3;
          bVar13 = false;
        }
        if (!bVar13) {
          bVar13 = false;
          goto LAB_0014baa1;
        }
        lVar12 = lVar12 + 1;
        iVar5 = dun->ent_n[(uint)ridx];
      } while (lVar12 < iVar5);
      bVar13 = 0 < iVar6;
    }
    if (bVar13) {
      uVar7 = Rand_div(p[iVar5]);
      iVar5 = dun->ent_n[(uint)ridx];
      iVar6 = 0;
      do {
        iVar1 = iVar5 + -1;
        if (iVar6 == iVar1) {
          if (((int)uVar7 < (int)p[iVar6]) || ((int)p[iVar5] <= (int)uVar7)) {
            __assert_fail("accum[low] <= chosen && accum[high] > chosen",
                          "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/gen-cave.c"
                          ,0x115,
                          "struct loc choose_random_entrance(struct chunk *, int, const struct loc *, int, const struct loc *, int)"
                         );
          }
          mem_free(p);
          local_50 = dun->ent[(uint)ridx][iVar6];
          iVar10 = iVar6;
        }
        else {
          iVar10 = (iVar5 + iVar6) / 2;
          if ((int)uVar7 < (int)p[iVar10]) {
            iVar5 = iVar10;
            iVar10 = iVar6;
          }
        }
        bVar13 = iVar6 != iVar1;
        iVar6 = iVar10;
      } while (bVar13);
      bVar13 = false;
    }
    else {
      mem_free(p);
      bVar13 = true;
    }
LAB_0014baa1:
    if (!bVar13) {
      return (loc_conflict)local_50;
    }
  }
  lVar8 = loc(0,0);
  return lVar8;
}

Assistant:

static struct loc choose_random_entrance(struct chunk *c, int ridx,
	const struct loc *tgt, int bias, const struct loc *exc, int nexc)
{
	assert(ridx >= 0 && ridx < dun->cent_n);
	if (dun->ent_n[ridx] > 0) {
		int nchoice = 0;
		int *accum = mem_alloc((dun->ent_n[ridx] + 1) *
			sizeof(*accum));
		int i;

		accum[0] = 0;
		for (i = 0; i < dun->ent_n[ridx]; ++i) {
			bool included = square_is_granite_with_flag(c,
				dun->ent[ridx][i], SQUARE_WALL_OUTER);

			if (included) {
				int j = 0;

				while (1) {
					struct loc diff;

					if (j >= nexc) {
						break;
					}
					diff = loc_diff(dun->ent[ridx][i],
						exc[j]);
					if (ABS(diff.x) <= 1 &&
							ABS(diff.y) <= 1 &&
							(diff.x != 0 ||
							diff.y != 0)) {
						included = false;
						break;
					}
					++j;
				}
			}
			if (included) {
				if (tgt) {
					int d, biased;

					assert(bias >= 0);
					d = distance(dun->ent[ridx][i], *tgt);
					if (d == 0) {
						/*
						 * There's an exact match.  Use
						 * it.
						 */
						mem_free(accum);
						return dun->ent[ridx][i];
					}

					biased = MAX(1, bias - d);
					/*
					 * Squaring here is just a guess without
					 * any specific reason to back it.
					 */
					accum[i + 1] = accum[i] +
						biased * biased;
				} else {
					accum[i + 1] = accum[i] + 1;
				}
				++nchoice;
			} else {
				accum[i + 1] = accum[i];
			}
		}
		if (nchoice > 0) {
			int chosen = randint0(accum[dun->ent_n[ridx]]);
			int low = 0, high = dun->ent_n[ridx];

			/* Locate the selection by binary search. */
			while (1) {
				int mid;

				if (low == high - 1) {
					assert(accum[low] <= chosen &&
						accum[high] > chosen);
					mem_free(accum);
					return dun->ent[ridx][low];
				}
				mid = (low + high) / 2;
				if (accum[mid] <= chosen) {
					low = mid;
				} else {
					high = mid;
				}
			}
		}
		mem_free(accum);
	}

	/* There's no satisfactory marked entrances. */
	return loc(0, 0);
}